

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AdditionGeneralizationImpl.hpp
# Opt level: O1

void __thiscall
Inferences::AdditionGeneralizationImpl::MonomSet<Kernel::NumTraits<Kernel::RationalConstantType>_>::
MonomSet(MonomSet<Kernel::NumTraits<Kernel::RationalConstantType>_> *this,Variable var,
        Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>
        *poly)

{
  Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> **ppMVar1;
  Perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>
  *r;
  InnerType *r_00;
  Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *pMVar2;
  long lVar3;
  ulong uVar4;
  Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *pMVar5;
  Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> local_98;
  uint local_68;
  MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>_> *local_60;
  Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_> local_58;
  
  local_58._cursor = (Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *)0x0;
  local_58._end = (Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *)0x0;
  local_58._capacity = 0;
  local_58._stack = (Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *)0x0;
  ::Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_>::Stack
            (&this->_cancellable,&local_58);
  ::Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_>::~Stack(&local_58);
  ::Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_>::reserve
            (&this->_cancellable,
             (ulong)((int)((ulong)((long)(poly->_ptr->_summands)._cursor -
                                  (long)(poly->_ptr->_summands)._stack) >> 4) * -0x55555555 - 1));
  local_98.numeral._num._val[0]._mp_d = (mp_limb_t *)poly->_ptr;
  pMVar5 = (((Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_> *)
            local_98.numeral._num._val[0]._mp_d)->_summands)._stack;
  pMVar2 = (((Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_> *)
            local_98.numeral._num._val[0]._mp_d)->_summands)._cursor;
  lVar3 = (long)pMVar2 - (long)pMVar5;
  if (pMVar5 != (Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *)0x0 && lVar3 != 0) {
    uVar4 = (ulong)(pMVar2 != pMVar5);
    r = &local_98.factors;
    r_00 = &local_98.numeral._den;
    do {
      Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>::tryVar(&local_98);
      if (((char)local_98.numeral._num._val[0]._mp_alloc == '\0') ||
         (((char)local_98.numeral._num._val[0]._mp_alloc != '\0' &&
          (local_98.numeral._num._val[0]._mp_size != var._num)))) {
        Kernel::IntegerConstantType::IntegerConstantType(r_00,(IntegerConstantType *)pMVar5);
        Kernel::IntegerConstantType::IntegerConstantType
                  ((IntegerConstantType *)r,&(pMVar5->numeral)._den);
        local_68 = (pMVar5->factors)._id;
        local_60 = (pMVar5->factors)._ptr;
        if ((this->_cancellable)._cursor == (this->_cancellable)._end) {
          ::Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_>::expand
                    (&this->_cancellable);
        }
        pMVar5 = (this->_cancellable)._cursor;
        Kernel::IntegerConstantType::IntegerConstantType((IntegerConstantType *)pMVar5,r_00);
        Kernel::IntegerConstantType::IntegerConstantType
                  (&(pMVar5->numeral)._den,(IntegerConstantType *)r);
        (pMVar5->factors)._id = local_68;
        (pMVar5->factors)._ptr = local_60;
        ppMVar1 = &(this->_cancellable)._cursor;
        *ppMVar1 = *ppMVar1 + 1;
        mpz_clear((__mpz_struct *)r);
        mpz_clear(r_00->_val);
      }
      if (uVar4 < (ulong)((lVar3 >> 4) * -0x5555555555555555)) {
        pMVar5 = ((Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_> *)
                 local_98.numeral._num._val[0]._mp_d)->_stack + uVar4;
        uVar4 = uVar4 + 1;
      }
      else {
        pMVar5 = (Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *)0x0;
      }
    } while (pMVar5 != (Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *)0x0);
  }
  return;
}

Assistant:

MonomSet(Variable var, Perfect<Polynom<NumTraits>> poly) : MonomSet(decltype(_cancellable)()) 
  {
    _cancellable.reserve(poly->nSummands() - 1);
    for (auto const& monom : poly->iterSummands()) {
      if (monom.tryVar() != some(var)) {
        _cancellable.push(monom);
      }
    }
  }